

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool httplib::detail::process_client_socket<std::function<bool(httplib::Stream&)>>
               (socket_t sock,time_t read_timeout_sec,time_t read_timeout_usec,
               time_t write_timeout_sec,time_t write_timeout_usec,
               function<bool_(httplib::Stream_&)> *callback)

{
  bool bVar1;
  SocketStream strm;
  Stream local_30;
  socket_t local_28;
  time_t local_20;
  time_t local_18;
  time_t local_10;
  time_t local_8;
  
  local_30._vptr_Stream = (_func_int **)&PTR__Stream_001416e8;
  local_28 = sock;
  local_20 = read_timeout_sec;
  local_18 = read_timeout_usec;
  local_10 = write_timeout_sec;
  local_8 = write_timeout_usec;
  bVar1 = std::function<bool_(httplib::Stream_&)>::operator()(callback,&local_30);
  return bVar1;
}

Assistant:

inline bool process_client_socket(socket_t sock, time_t read_timeout_sec,
										  time_t read_timeout_usec,
										  time_t write_timeout_sec,
										  time_t write_timeout_usec, T callback) {
			SocketStream strm(sock, read_timeout_sec, read_timeout_usec,
							  write_timeout_sec, write_timeout_usec);
			return callback(strm);
		}